

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

int xmlSchematronRegisterVariables
              (xmlXPathContextPtr ctxt,xmlSchematronLetPtr_conflict let,xmlDocPtr instance,
              xmlNodePtr cur)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlXPathObjectPtr value;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  char *pcVar5;
  
  ctxt->doc = instance;
  ctxt->node = cur;
  if (let == (xmlSchematronLetPtr_conflict)0x0) {
    return 0;
  }
  pcVar5 = "Evaluation of compiled expression failed\n";
  do {
    value = xmlXPathCompiledEval(let->comp,ctxt);
    if (value == (xmlXPathObjectPtr)0x0) {
LAB_0017eb4e:
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,pcVar5);
      return -1;
    }
    iVar2 = xmlXPathRegisterVariableNS(ctxt,let->name,(xmlChar *)0x0,value);
    if (iVar2 != 0) {
      pcVar5 = "Registering a let variable failed\n";
      goto LAB_0017eb4e;
    }
    let = let->next;
    if (let == (xmlSchematronLetPtr)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
xmlSchematronRegisterVariables(xmlXPathContextPtr ctxt, xmlSchematronLetPtr let,
                               xmlDocPtr instance, xmlNodePtr cur)
{
    xmlXPathObjectPtr let_eval;

    ctxt->doc = instance;
    ctxt->node = cur;
    while (let != NULL) {
        let_eval = xmlXPathCompiledEval(let->comp, ctxt);
        if (let_eval == NULL) {
            xmlGenericError(xmlGenericErrorContext,
                            "Evaluation of compiled expression failed\n");
            return -1;
        }
        if(xmlXPathRegisterVariableNS(ctxt, let->name, NULL, let_eval)) {
            xmlGenericError(xmlGenericErrorContext,
                            "Registering a let variable failed\n");
            return -1;
        }
        let = let->next;
    }
    return 0;
}